

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall SubcommandProgram_CaseCheck_Test::TestBody(SubcommandProgram_CaseCheck_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [4];
  
  std::__cxx11::string::string((string *)local_38,"Start",(allocator *)&local_40);
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_38,
             &stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)local_38);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x1ea,
             "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_38);
  this_00 = &(this->super_SubcommandProgram).super_TApp.app;
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_38,"start",(allocator *)&local_40);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_38,
             &stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)local_38);
  TApp::run((TApp *)this);
  CLI::App::reset(this_00);
  CLI::App::ignore_case((this->super_SubcommandProgram).start,true);
  TApp::run((TApp *)this);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_38,"Start",(allocator *)&local_40);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_38,
             &stack0xffffffffffffffe8);
  std::__cxx11::string::~string((string *)local_38);
  TApp::run((TApp *)this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CaseCheck) {
    args = {"Start"};
    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"start"};
    run();

    app.reset();
    start->ignore_case();
    run();

    app.reset();
    args = {"Start"};
    run();
}